

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O0

double duration(int64_t s,int64_t e)

{
  int64_t dt;
  int64_t e_local;
  int64_t s_local;
  
  return (double)(e - s) / 1000000.0;
}

Assistant:

double duration(int64_t s, int64_t e)
{
#if OQPI_PLATFORM_WIN
    static const auto F = query_performance_frequency();
    auto dt             = e - s;
    return (dt / (F * 1.0)) * 1000.0;

#elif OQPI_PLATFORM_POSIX
    auto dt = e - s;
    return dt / 1e6;

#endif
}